

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_authority_key_id(uchar **p,uchar *end,mbedtls_x509_authority *authority_key_id)

{
  int iVar1;
  uchar *puVar2;
  size_t local_28;
  size_t len;
  
  local_28 = 0;
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,0x30);
  if (iVar1 == 0) {
    if (*p + local_28 != end) {
      return -0x2566;
    }
    iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,0x80);
    if (iVar1 == 0) {
      (authority_key_id->keyIdentifier).len = local_28;
      puVar2 = *p;
      (authority_key_id->keyIdentifier).p = puVar2;
      (authority_key_id->keyIdentifier).tag = 4;
      puVar2 = puVar2 + local_28;
      *p = puVar2;
    }
    else {
      if (iVar1 != -0x62) goto LAB_001b027e;
      puVar2 = *p;
    }
    if (end <= puVar2) {
LAB_001b034c:
      if (puVar2 != end) {
        return -0x2566;
      }
      return 0;
    }
    iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,0xa1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_x509_get_subject_alt_name_ext
                        (p,*p + local_28,&authority_key_id->authorityCertIssuer);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,0x82);
      if (iVar1 == 0) {
        (authority_key_id->authorityCertSerialNumber).len = local_28;
        puVar2 = *p;
        (authority_key_id->authorityCertSerialNumber).p = puVar2;
        (authority_key_id->authorityCertSerialNumber).tag = 2;
        puVar2 = puVar2 + local_28;
        *p = puVar2;
        goto LAB_001b034c;
      }
    }
  }
LAB_001b027e:
  return iVar1 + -0x2500;
}

Assistant:

static int x509_get_authority_key_id(unsigned char **p,
                                     unsigned char *end,
                                     mbedtls_x509_authority *authority_key_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0u;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    ret = mbedtls_asn1_get_tag(p, end, &len,
                               MBEDTLS_ASN1_CONTEXT_SPECIFIC);

    /* KeyIdentifier is an OPTIONAL field */
    if (ret == 0) {
        authority_key_id->keyIdentifier.len = len;
        authority_key_id->keyIdentifier.p = *p;
        /* Setting tag of the keyIdentfier intentionally to 0x04.
         * Although the .keyIdentfier field is CONTEXT_SPECIFIC ([0] OPTIONAL),
         * its tag with the content is the payload of on OCTET STRING primitive */
        authority_key_id->keyIdentifier.tag = MBEDTLS_ASN1_OCTET_STRING;

        *p += len;
    } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p < end) {
        /* Getting authorityCertIssuer using the required specific class tag [1] */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        1)) != 0) {
            /* authorityCertIssuer and authorityCertSerialNumber MUST both
               be present or both be absent. At this point we expect to have both. */
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }
        /* "end" also includes the CertSerialNumber field so "len" shall be used */
        ret = mbedtls_x509_get_subject_alt_name_ext(p,
                                                    (*p+len),
                                                    &authority_key_id->authorityCertIssuer);
        if (ret != 0) {
            return ret;
        }

        /* Getting authorityCertSerialNumber using the required specific class tag [2] */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | 2)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }
        authority_key_id->authorityCertSerialNumber.len = len;
        authority_key_id->authorityCertSerialNumber.p = *p;
        authority_key_id->authorityCertSerialNumber.tag = MBEDTLS_ASN1_INTEGER;
        *p += len;
    }

    if (*p != end) {
        return MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
               MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}